

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.h
# Opt level: O1

void __thiscall
FONQRI::UserLog::UserLog
          (UserLog *this,string *dateTime,string *line,string *file,string *text,string *type,
          string *user)

{
  pointer pcVar1;
  
  (this->dateTime)._M_dataplus._M_p = (pointer)&(this->dateTime).field_2;
  pcVar1 = (dateTime->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + dateTime->_M_string_length);
  (this->line)._M_dataplus._M_p = (pointer)&(this->line).field_2;
  pcVar1 = (line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->line,pcVar1,pcVar1 + line->_M_string_length);
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  pcVar1 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file,pcVar1,pcVar1 + file->_M_string_length);
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + text->_M_string_length);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar1,pcVar1 + type->_M_string_length);
  (this->user)._M_dataplus._M_p = (pointer)&(this->user).field_2;
  pcVar1 = (user->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->user,pcVar1,pcVar1 + user->_M_string_length);
  return;
}

Assistant:

UserLog(std::string dateTime, std::string line, std::string file,
		std::string text, std::string type, std::string user)
	: dateTime(dateTime), line(line), file(file), text(text), type(type),
	  user(user)
	{
	}